

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa_array.c
# Opt level: O2

aspa_status
aspa_array_insert_internal(aspa_array *array,size_t index,aspa_record *record,_Bool copy_providers)

{
  long lVar1;
  undefined4 uVar2;
  aspa_record *paVar3;
  uint32_t *__dest;
  long lVar4;
  aspa_status aVar5;
  size_t sVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  aVar5 = ASPA_ERROR;
  if (array->capacity <= (ulong)array->size) {
    paVar3 = (aspa_record *)lrtr_realloc(array->data,array->capacity * 0x18 + 1000);
    if (paVar3 == (aspa_record *)0x0) goto LAB_00107ad5;
    array->data = paVar3;
    array->capacity = array->capacity + 1000;
  }
  if (record->provider_count == 0) {
    __dest = (uint32_t *)0x0;
  }
  else if (copy_providers) {
    sVar6 = record->provider_count << 2;
    __dest = (uint32_t *)lrtr_malloc(sVar6);
    if (__dest == (uint32_t *)0x0) goto LAB_00107ad5;
    memcpy(__dest,record->provider_asns,sVar6);
  }
  else {
    __dest = record->provider_asns;
  }
  lVar4 = array->size - index;
  if (index <= array->size && lVar4 != 0) {
    memmove(array->data + index + 1,array->data + index,lVar4 * 0x18);
  }
  paVar3 = array->data;
  paVar3[index].provider_asns = record->provider_asns;
  uVar2 = *(undefined4 *)&record->field_0x4;
  sVar6 = record->provider_count;
  paVar3 = paVar3 + index;
  paVar3->customer_asn = record->customer_asn;
  *(undefined4 *)&paVar3->field_0x4 = uVar2;
  paVar3->provider_count = sVar6;
  array->data[index].provider_asns = __dest;
  array->size = array->size + 1;
  aVar5 = ASPA_SUCCESS;
LAB_00107ad5:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return aVar5;
  }
  __stack_chk_fail();
}

Assistant:

static enum aspa_status aspa_array_insert_internal(struct aspa_array *array, size_t index, struct aspa_record *record,
						   bool copy_providers)
{
	// check if this element will fit into the array
	if (array->size >= array->capacity) {
		// increasing the array's size so the new element fits
		if (aspa_array_reallocate(array) != ASPA_SUCCESS)
			return ASPA_ERROR;
	}

	uint32_t *provider_asns = NULL;

	if (record->provider_count > 0) {
		if (copy_providers) {
			size_t provider_size = record->provider_count * sizeof(uint32_t);

			provider_asns = lrtr_malloc(provider_size);
			if (!provider_asns)
				return ASPA_ERROR;

			memcpy(provider_asns, record->provider_asns, provider_size);
		} else {
			provider_asns = record->provider_asns;
		}
	}

	// No need to move if last element
	if (index < array->size) {
		size_t trailing = (array->size - index) * sizeof(struct aspa_record);

		/*               trailing
		 *		     /-------------\
		 * #3 #8 #11 #24 #30 #36 #37
		 * #3 #8 #11  *  #24 #30 #36 #37
		 *            ^   ^
		 *		index   index + 1
		 */
		memmove(&array->data[index + 1], &array->data[index], trailing);
	}

	// append the record at the end
	array->data[index] = *record;
	array->data[index].provider_asns = provider_asns;
	array->size += 1;

	return ASPA_SUCCESS;
}